

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O2

void txvalidationcache_tests::ValidateCheckInputsForAllFlags
               (CTransaction *tx,uint32_t failing_flags,bool add_to_cache,
               CCoinsViewCache *active_coins_tip,ValidationCache *validation_cache)

{
  long lVar1;
  readonly_property65 rVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  iterator pvVar6;
  iterator pvVar7;
  bool *pbVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  check_type cVar10;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  assertion_result local_4a0;
  char **local_488;
  assertion_result local_480;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  bool expected_return_value;
  bool ret;
  undefined1 local_3f8 [24];
  char **local_3e0;
  TxValidationState state;
  FastRandomContext insecure_rand;
  PrecomputedTransactionData txdata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&txdata,0,0x102);
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  txdata._281_8_ = 0;
  FastRandomContext::FastRandomContext(&insecure_rand,true);
  iVar4 = 10000;
  while (bVar9 = iVar4 != 0, iVar4 = iVar4 + -1, bVar9) {
    state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
    state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
    state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
    uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                      (&insecure_rand.super_RandomMixin<FastRandomContext>,0x200000);
    uVar5 = uVar3 | 0x801;
    if ((uVar3 >> 8 & 1) == 0) {
      uVar5 = uVar3;
    }
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)local_3f8,(CCoinsView *)active_coins_tip,false);
    uVar5 = uVar5 >> 0xb & 1 | uVar5;
    pvVar7 = (iterator)(ulong)add_to_cache;
    pvVar6 = &DAT_00000001;
    bVar9 = CheckInputScripts(tx,&state,(CCoinsViewCache *)local_3f8,uVar5,true,add_to_cache,&txdata
                              ,validation_cache,
                              (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)local_3f8);
    expected_return_value = (failing_flags & uVar5) == 0;
    local_410 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_408 = "";
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = pvVar7;
    msg.m_begin = pvVar6;
    file.m_end = (iterator)0x95;
    file.m_begin = (iterator)&local_410;
    ret = bVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_420,msg);
    local_3f8[8] = 0;
    local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_3f8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3e0 = (char **)0xc694e1;
    local_430 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_428 = "";
    pvVar6 = (iterator)0x2;
    pbVar8 = &ret;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((CCoinsViewCache *)local_3f8,&local_430,0x95,1,2,pbVar8,"ret",&expected_return_value,
               "expected_return_value");
    if ((ret & add_to_cache) == 1) {
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_458 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_450 = "";
      local_468 = &boost::unit_test::basic_cstring<char_const>::null;
      local_460 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = pbVar8;
      msg_00.m_begin = pvVar6;
      file_00.m_end = (iterator)0x9b;
      file_00.m_begin = (iterator)&local_458;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_468,
                 msg_00);
      _cVar10 = 0x5769c2;
      CCoinsViewCache::CCoinsViewCache
                ((CCoinsViewCache *)local_3f8,(CCoinsView *)active_coins_tip,false);
      rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           CheckInputScripts(tx,&state,(CCoinsViewCache *)local_3f8,uVar5,true,true,&txdata,
                             validation_cache,&scriptchecks);
      local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
      local_480.m_message.px = (element_type *)0x0;
      local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_4b0 = 
      "CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks)"
      ;
      local_4a8 = "";
      local_4a0.m_message.px = (element_type *)((ulong)local_4a0.m_message.px & 0xffffffffffffff00);
      local_4a0._0_8_ = &PTR__lazy_ostream_0113a070;
      local_4a0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_488 = &local_4b0;
      local_4c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4b8 = "";
      pvVar7 = (iterator)0x0;
      pvVar6 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                (&local_480,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar10,(size_t)&local_4c0,0x9b);
      boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
      CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)local_3f8);
      local_4d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4c8 = "";
      local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar10 = 0x576afe;
      msg_01.m_end = pvVar7;
      msg_01.m_begin = pvVar6;
      file_01.m_end = (iterator)0x9c;
      file_01.m_begin = (iterator)&local_4d0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4e0,
                 msg_01);
      local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           (scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
            super__Vector_impl_data._M_start ==
           scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
           super__Vector_impl_data._M_finish);
      local_4a0.m_message.px = (element_type *)0x0;
      local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_480._0_8_ = "scriptchecks.empty()";
      local_480.m_message.px = (element_type *)0xc6720e;
      local_3f8[8] = 0;
      local_3f8._0_8_ = &PTR__lazy_ostream_0113a070;
      local_3f8._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_3e0 = (char **)&local_480;
      local_4f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4e8 = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_4a0,(lazy_ostream *)local_3f8,1,0,WARN,_cVar10,(size_t)&local_4f0,0x9c);
      boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
    }
    else {
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_500 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_4f8 = "";
      local_510 = &boost::unit_test::basic_cstring<char_const>::null;
      local_508 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_02.m_end = pbVar8;
      msg_02.m_begin = pvVar6;
      file_02.m_end = (iterator)0xa1;
      file_02.m_begin = (iterator)&local_500;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_510,
                 msg_02);
      _cVar10 = 0x576c3b;
      CCoinsViewCache::CCoinsViewCache
                ((CCoinsViewCache *)local_3f8,(CCoinsView *)active_coins_tip,false);
      rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           CheckInputScripts(tx,&state,(CCoinsViewCache *)local_3f8,uVar5,true,add_to_cache,&txdata,
                             validation_cache,&scriptchecks);
      local_480.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
      local_480.m_message.px = (element_type *)0x0;
      local_480.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_4b0 = 
      "CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks)"
      ;
      local_4a8 = "";
      local_4a0.m_message.px = (element_type *)((ulong)local_4a0.m_message.px & 0xffffffffffffff00);
      local_4a0._0_8_ = &PTR__lazy_ostream_0113a070;
      local_4a0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_488 = &local_4b0;
      local_520 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_518 = "";
      pvVar7 = (iterator)0x0;
      pvVar6 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                (&local_480,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar10,(size_t)&local_520,0xa1);
      boost::detail::shared_count::~shared_count(&local_480.m_message.pn);
      CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)local_3f8);
      local_530 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_528 = "";
      local_540 = &boost::unit_test::basic_cstring<char_const>::null;
      local_538 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_03.m_end = pvVar7;
      msg_03.m_begin = pvVar6;
      file_03.m_end = (iterator)0xa2;
      file_03.m_begin = (iterator)&local_530;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_540,
                 msg_03);
      local_3f8[8] = 0;
      local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
      local_3f8._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_3e0 = (char **)0xc694e1;
      local_550 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_548 = "";
      local_4a0._0_8_ =
           ((long)scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x50;
      local_480._0_8_ =
           ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x68;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                ((CCoinsViewCache *)local_3f8,&local_550,0xa2,1,2,&local_4a0,"scriptchecks.size()",
                 &local_480,"tx.vin.size()");
    }
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&scriptchecks);
    ValidationState<TxValidationResult>::~ValidationState
              (&state.super_ValidationState<TxValidationResult>);
  }
  ChaCha20::~ChaCha20(&insecure_rand.rng);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    PrecomputedTransactionData txdata;

    FastRandomContext insecure_rand(true);

    for (int count = 0; count < 10000; ++count) {
        TxValidationState state;

        // Randomly selects flag combinations
        uint32_t test_flags = (uint32_t) insecure_rand.randrange((SCRIPT_VERIFY_END_MARKER - 1) << 1);

        // Filter out incompatible flag choices
        if ((test_flags & SCRIPT_VERIFY_CLEANSTACK)) {
            // CLEANSTACK requires P2SH and WITNESS, see VerifyScript() in
            // script/interpreter.cpp
            test_flags |= SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS;
        }
        if ((test_flags & SCRIPT_VERIFY_WITNESS)) {
            // WITNESS requires P2SH
            test_flags |= SCRIPT_VERIFY_P2SH;
        }
        bool ret = CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, nullptr);
        // CheckInputScripts should succeed iff test_flags doesn't intersect with
        // failing_flags
        bool expected_return_value = !(test_flags & failing_flags);
        BOOST_CHECK_EQUAL(ret, expected_return_value);

        // Test the caching
        if (ret && add_to_cache) {
            // Check that we get a cache hit if the tx was valid
            std::vector<CScriptCheck> scriptchecks;
            BOOST_CHECK(CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks));
            BOOST_CHECK(scriptchecks.empty());
        } else {
            // Check that we get script executions to check, if the transaction
            // was invalid, or we didn't add to cache.
            std::vector<CScriptCheck> scriptchecks;
            BOOST_CHECK(CheckInputScripts(tx, state, &active_coins_tip, test_flags, true, add_to_cache, txdata, validation_cache, &scriptchecks));
            BOOST_CHECK_EQUAL(scriptchecks.size(), tx.vin.size());
        }
    }
}